

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O1

void __thiscall
amrex::StateDescriptor::setUpMaps
          (StateDescriptor *this,int *use_default_map,InterpBase *default_map,int start_comp,
          int num_comp,InterpBase ***maps,int *nmaps,int **map_start_comp,int **map_num_comp,
          int **max_start_comp,int **min_end_comp)

{
  int iVar1;
  pointer ppIVar2;
  InterpBase *pIVar3;
  InterpBase **ppIVar4;
  int *piVar5;
  InterpBase *pIVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  InterpBase *pIVar11;
  ulong uVar12;
  
  *maps = (InterpBase **)0x0;
  *map_start_comp = (int *)0x0;
  *map_num_comp = (int *)0x0;
  *max_start_comp = (int *)0x0;
  *min_end_comp = (int *)0x0;
  ppIVar2 = (this->mapper_comp).
            super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
            super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  pIVar6 = ppIVar2[start_comp];
  *nmaps = 1;
  *use_default_map = 1;
  if (1 < num_comp) {
    if (pIVar6 == (InterpBase *)0x0) {
      pIVar6 = default_map;
    }
    lVar8 = (long)(start_comp + 1);
    do {
      pIVar3 = ppIVar2[lVar8];
      pIVar11 = default_map;
      if (pIVar3 != (InterpBase *)0x0) {
        *use_default_map = 0;
        pIVar11 = pIVar3;
      }
      if (pIVar6 != pIVar11) {
        *nmaps = *nmaps + 1;
        pIVar6 = pIVar11;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < num_comp + start_comp);
  }
  if (*use_default_map == 0) {
    lVar8 = (long)*nmaps;
    uVar9 = lVar8 * 8;
    if (lVar8 < 0) {
      uVar9 = 0xffffffffffffffff;
    }
    uVar12 = lVar8 * 4;
    if (lVar8 < 0) {
      uVar12 = 0xffffffffffffffff;
    }
    ppIVar4 = (InterpBase **)operator_new__(uVar9);
    *maps = ppIVar4;
    piVar5 = (int *)operator_new__(uVar12);
    *map_start_comp = piVar5;
    piVar5 = (int *)operator_new__(uVar12);
    *map_num_comp = piVar5;
    piVar5 = (int *)operator_new__(uVar12);
    *min_end_comp = piVar5;
    piVar5 = (int *)operator_new__(uVar12);
    *max_start_comp = piVar5;
    pIVar6 = (this->mapper_comp).
             super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
             super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>._M_impl.
             super__Vector_impl_data._M_start[start_comp];
    if (pIVar6 == (InterpBase *)0x0) {
      pIVar6 = default_map;
    }
    **maps = pIVar6;
    **map_start_comp = start_comp;
    **map_num_comp = 1;
    **min_end_comp =
         (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [start_comp];
    **max_start_comp =
         (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [start_comp];
    if (1 < num_comp) {
      lVar8 = (long)(start_comp + 1);
      iVar7 = 0;
      do {
        pIVar6 = (this->mapper_comp).
                 super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                 super__Vector_base<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar8];
        if (pIVar6 == (InterpBase *)0x0) {
          pIVar6 = default_map;
        }
        if ((*maps)[iVar7] == pIVar6) {
          (*map_num_comp)[iVar7] = (*map_num_comp)[iVar7] + 1;
          iVar1 = (*min_end_comp)[iVar7];
          iVar10 = (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start[lVar8];
          if (iVar10 < iVar1) {
            iVar10 = iVar1;
          }
          (*min_end_comp)[iVar7] = iVar10;
          iVar1 = (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar8];
          iVar10 = (*max_start_comp)[iVar7];
          if (iVar1 < iVar10) {
            iVar10 = iVar1;
          }
          (*max_start_comp)[iVar7] = iVar10;
        }
        else {
          (*maps)[(long)iVar7 + 1] = pIVar6;
          (*map_start_comp)[(long)iVar7 + 1] = (int)lVar8;
          (*map_num_comp)[(long)iVar7 + 1] = 1;
          (*min_end_comp)[(long)iVar7 + 1] =
               (this->min_map_end_comp).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
          (*max_start_comp)[(long)iVar7 + 1] =
               (this->max_map_start_comp).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar8];
          iVar7 = iVar7 + 1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 < num_comp + start_comp);
    }
  }
  return;
}

Assistant:

void
StateDescriptor::setUpMaps (int&                use_default_map,
                            const InterpBase*   default_map,
                            int                 start_comp,
                            int                 num_comp,
                            InterpBase**&       maps,
                            int&                nmaps,
                            int*&               map_start_comp,
                            int*&               map_num_comp,
                            int*&               max_start_comp,
                            int*&               min_end_comp) const
{
    BL_ASSERT(start_comp>=0 && start_comp+num_comp-1 < ncomp && num_comp>0);

    maps           = 0;
    map_start_comp = 0;
    map_num_comp   = 0;
    max_start_comp = 0;
    min_end_comp   = 0;
    //
    // First, count number of interpolaters needed and allocate.
    //
    InterpBase* map = mapper_comp[start_comp];
    if (!map) map = (InterpBase*) default_map;
    nmaps = 1;
    int icomp = start_comp+1;

    use_default_map = 1;
    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];
        if (!mapper_icomp)
        {
            mapper_icomp = (InterpBase *) default_map;
        }
        else
        {
            use_default_map = 0;
        }
        if (map != mapper_icomp)
        {
            map = mapper_icomp;
            nmaps++;
        }
        icomp++;
    }

    if (use_default_map) return;

    maps           = new InterpBase*[nmaps];
    map_start_comp = new int[nmaps];
    map_num_comp   = new int[nmaps];
    min_end_comp   = new int[nmaps];
    max_start_comp = new int[nmaps];
    //
    // Now fill the slots.
    //
    int imap             = 0;

    if (mapper_comp[start_comp])
    {
        maps[imap] = mapper_comp[start_comp];
    }
    else
    {
        maps[imap] = (InterpBase *) default_map;
    }

    icomp                = start_comp+1;
    map_start_comp[imap] = start_comp;
    map_num_comp[imap]   = 1;
    min_end_comp[imap]   = min_map_end_comp[start_comp];
    max_start_comp[imap] = max_map_start_comp[start_comp];

    while (icomp < start_comp+num_comp)
    {
        InterpBase* mapper_icomp = mapper_comp[icomp];

        if (!mapper_icomp)
            mapper_icomp = (InterpBase *) default_map;

        if (maps[imap] != mapper_icomp)
        {
            imap++;

            BL_ASSERT (imap < nmaps);

            maps[imap]           = mapper_icomp;
            map_start_comp[imap] = icomp;
            map_num_comp[imap]   = 1;
            min_end_comp[imap]   = min_map_end_comp[icomp];
            max_start_comp[imap] = max_map_start_comp[icomp];

        }
        else
        {
            map_num_comp[imap]++;
            min_end_comp[imap]   = std::max(min_end_comp[imap],min_map_end_comp[icomp]);
            max_start_comp[imap] = std::min(max_start_comp[imap],max_map_start_comp[icomp]);
        }
        icomp++;
    }
}